

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O3

void __thiscall Diligent::ShaderResourcesGL::~ShaderResourcesGL(ShaderResourcesGL *this)

{
  UniformBufferInfo *pUVar1;
  void *ptr;
  IMemoryAllocator *pIVar2;
  Uint32 UVar3;
  
  if (this->m_NumUniformBuffers != 0) {
    UVar3 = 0;
    do {
      GetUniformBuffer(this,UVar3);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this->m_NumUniformBuffers);
  }
  if (this->m_NumTextures != 0) {
    UVar3 = 0;
    do {
      GetTexture(this,UVar3);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this->m_NumTextures);
  }
  if (this->m_NumImages != 0) {
    UVar3 = 0;
    do {
      GetImage(this,UVar3);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this->m_NumImages);
  }
  if (this->m_NumStorageBlocks != 0) {
    UVar3 = 0;
    do {
      GetStorageBlock(this,UVar3);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this->m_NumStorageBlocks);
  }
  pUVar1 = this->m_UniformBuffers;
  if (pUVar1 != (UniformBufferInfo *)0x0) {
    pIVar2 = GetRawAllocator();
    (*pIVar2->_vptr_IMemoryAllocator[1])(pIVar2,pUVar1);
  }
  ptr = (this->m_UBReflectionBuffer)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_UBReflectionBuffer,ptr);
  }
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  return;
}

Assistant:

ShaderResourcesGL::~ShaderResourcesGL()
{
    // clang-format off
    ProcessResources(
        [&](UniformBufferInfo& UB)
        {
            UB.~UniformBufferInfo();
        },
        [&](TextureInfo& Sam)
        {
            Sam.~TextureInfo();
        },
        [&](ImageInfo& Img)
        {
            Img.~ImageInfo();
        },
        [&](StorageBlockInfo& SB)
        {
            SB.~StorageBlockInfo();
        }
    );
    // clang-format on

    void* RawMemory = m_UniformBuffers;
    if (RawMemory != nullptr)
    {
        auto& MemAllocator = GetRawAllocator();
        MemAllocator.Free(RawMemory);
    }
}